

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

free_ptr<LRQstate> scoped_calloc_or_throw<LRQstate>(void)

{
  LRQstate *this;
  _Head_base<0UL,_LRQstate_*,_false> extraout_RDX;
  _Tuple_impl<1UL,_void_(*)(void_*)> in_RDI;
  free_ptr<LRQstate> fVar1;
  LRQstate *temp;
  size_t in_stack_00000198;
  pointer in_stack_ffffffffffffffc8;
  
  this = calloc_or_throw<LRQstate>(in_stack_00000198);
  memset(this,0,0x950);
  LRQstate::LRQstate((LRQstate *)0x3ba6b5);
  std::unique_ptr<LRQstate,void(*)(void*)>::unique_ptr<void(*)(void*),void>
            ((unique_ptr<LRQstate,_void_(*)(void_*)> *)this,in_stack_ffffffffffffffc8,
             (__enable_if_t<_is_lvalue_reference<void_(*)(void_*)>::value,_void_(*&&)(void_*)>)
             0x3ba6d5);
  fVar1._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.super__Head_base<0UL,_LRQstate_*,_false>.
  _M_head_impl = extraout_RDX._M_head_impl;
  fVar1._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       in_RDI.super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl;
  return (free_ptr<LRQstate>)
         fVar1._M_t.super___uniq_ptr_impl<LRQstate,_void_(*)(void_*)>._M_t.
         super__Tuple_impl<0UL,_LRQstate_*,_void_(*)(void_*)>;
}

Assistant:

free_ptr<T> scoped_calloc_or_throw()
{
  T* temp = calloc_or_throw<T>(1);
  new (temp) T();
  return std::unique_ptr<T, free_fn>(temp, destroy_free<T>);
}